

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::check_resource_write
          (OpCodePreprocessor *this,uint32_t var_id)

{
  StorageClass SVar1;
  SPIRVariable *pSVar2;
  
  pSVar2 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,var_id);
  if (pSVar2 == (SPIRVariable *)0x0) {
    SVar1 = StorageClassMax;
  }
  else {
    SVar1 = pSVar2->storage;
  }
  if (((this->compiler->msl_options).msl_version < 0x4e84) &&
     ((SVar1 == StorageClassStorageBuffer || (SVar1 == StorageClassUniform)))) {
    this->uses_resource_write = true;
  }
  return;
}

Assistant:

void CompilerMSL::OpCodePreprocessor::check_resource_write(uint32_t var_id)
{
	auto *p_var = compiler.maybe_get_backing_variable(var_id);
	StorageClass sc = p_var ? p_var->storage : StorageClassMax;
	if (!compiler.msl_options.supports_msl_version(2, 1) &&
	    (sc == StorageClassUniform || sc == StorageClassStorageBuffer))
		uses_resource_write = true;
}